

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
env_infrastructure_t
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this,environment_t *env,timer_manager_factory_t *timer_factory,
          error_logger_shptr_t *error_logger,coop_listener_unique_ptr_t *coop_listener,
          mbox_t *stats_distribution_mbox)

{
  actual_elapsed_timers_collector_t *this_00;
  environment_t *env_00;
  pointer *__ptr;
  _Head_base<0UL,_so_5::coop_listener_t_*,_false> local_98;
  mbox_t local_90;
  mbox_t local_88;
  actual_elapsed_timers_collector_t *local_80;
  final_dereg_coop_container_t *local_78;
  mbox_t *local_70;
  environment_t *local_68;
  timer_manager_factory_t *local_60;
  outliving_reference_t<so_5::timer_manager_t::elapsed_timers_collector_t> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  local_48;
  outliving_reference_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t> local_40
  ;
  actual_elapsed_timers_collector_t *local_38;
  
  local_70 = stats_distribution_mbox;
  local_60 = timer_factory;
  environment_infrastructure_t::environment_infrastructure_t
            (&this->super_environment_infrastructure_t);
  (this->super_environment_infrastructure_t)._vptr_environment_infrastructure_t =
       (_func_int **)&PTR__env_infrastructure_t_002c8978;
  this->m_env = env;
  local_68 = env;
  main_thread_sync_objects_t::main_thread_sync_objects_t(&this->m_sync_objects);
  std::_Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::_Deque_base
            (&(this->m_final_dereg_coops).
              super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>);
  this->m_shutdown_status = not_started;
  this_00 = &this->m_timers_collector;
  local_78 = &this->m_final_dereg_coops;
  st_reusable_stuff::actual_elapsed_timers_collector_t::actual_elapsed_timers_collector_t(this_00);
  local_58.m_ptr =
       (elapsed_timers_collector_t *)
       (error_logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _Stack_50._M_pi =
       (error_logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  (error_logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (error_logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_80 = this_00;
  local_38 = this_00;
  std::
  function<std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>_(std::shared_ptr<so_5::error_logger_t>,_so_5::outliving_reference_t<so_5::timer_manager_t::elapsed_timers_collector_t>)>
  ::operator()((function<std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>_(std::shared_ptr<so_5::error_logger_t>,_so_5::outliving_reference_t<so_5::timer_manager_t::elapsed_timers_collector_t>)>
                *)&this->m_timer_manager,(shared_ptr<so_5::error_logger_t> *)local_60,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  event_queue_impl_t::event_queue_impl_t(&this->m_event_queue,&this->m_sync_objects);
  local_98._M_head_impl =
       (coop_listener->_M_t).
       super___uniq_ptr_impl<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>.
       _M_t.
       super__Tuple_impl<0UL,_so_5::coop_listener_t_*,_std::default_delete<so_5::coop_listener_t>_>.
       super__Head_base<0UL,_so_5::coop_listener_t_*,_false>._M_head_impl;
  (coop_listener->_M_t).
  super___uniq_ptr_impl<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>._M_t.
  super__Tuple_impl<0UL,_so_5::coop_listener_t_*,_std::default_delete<so_5::coop_listener_t>_>.
  super__Head_base<0UL,_so_5::coop_listener_t_*,_false>._M_head_impl = (coop_listener_t *)0x0;
  st_reusable_stuff::coop_repo_t::coop_repo_t
            (&this->m_coop_repo,local_68,(coop_listener_unique_ptr_t *)&local_98);
  if (local_98._M_head_impl != (coop_listener_t *)0x0) {
    (*(local_98._M_head_impl)->_vptr_coop_listener_t[1])();
  }
  local_98._M_head_impl = (coop_listener_t *)0x0;
  local_48.m_ptr = &this->m_activity_tracker;
  (this->m_activity_tracker).m_waiting.m_is_in_working = false;
  (this->m_activity_tracker).m_working.m_work_started_at.__d.__r = 0;
  (this->m_activity_tracker).m_working.m_work_activity.m_count = 0;
  (this->m_activity_tracker).m_working.m_work_activity.m_total_time.__r = 0;
  (this->m_activity_tracker).m_working.m_work_activity.m_avg_time.__r = 0;
  (this->m_activity_tracker).m_waiting.m_work_started_at.__d.__r = 0;
  (this->m_activity_tracker).m_waiting.m_work_activity.m_count = 0;
  (this->m_activity_tracker).m_waiting.m_work_activity.m_total_time.__r = 0;
  (this->m_activity_tracker).m_waiting.m_work_activity.m_avg_time.__r = 0;
  (this->m_activity_tracker).m_working.m_is_in_working = false;
  local_40.m_ptr = &this->m_event_queue;
  st_reusable_stuff::
  default_disp_impl_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_mtsafe::impl::disp_ds_name_parts_t>
  ::default_disp_impl_t(&this->m_default_disp,&local_40,&local_48);
  env_00 = this->m_env;
  local_88.m_obj = local_70->m_obj;
  local_70->m_obj = (abstract_message_box_t *)0x0;
  stats::impl::st_env_stuff::next_turn_mbox_t::make();
  st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>::stats_controller_t
            (&this->m_stats_controller,env_00,&local_88,&local_90);
  intrusive_ptr_t<so_5::abstract_message_box_t>::dismiss_object(&local_90);
  intrusive_ptr_t<so_5::abstract_message_box_t>::dismiss_object(&local_88);
  return;
}

Assistant:

env_infrastructure_t< ACTIVITY_TRACKER >::env_infrastructure_t(
	environment_t & env,
	timer_manager_factory_t timer_factory,
	error_logger_shptr_t error_logger,
	coop_listener_unique_ptr_t coop_listener,
	mbox_t stats_distribution_mbox )
	:	m_env( env )
	,	m_timer_manager(
			timer_factory(
				std::move(error_logger),
				outliving_mutable(m_timers_collector) ) )
	,	m_event_queue( m_sync_objects )
	,	m_coop_repo( env, std::move(coop_listener) )
	,	m_default_disp(
			outliving_mutable(m_event_queue),
			outliving_mutable(m_activity_tracker) )
	,	m_stats_controller(
			m_env,
			std::move(stats_distribution_mbox),
			stats::impl::st_env_stuff::next_turn_mbox_t::make() )
	{}